

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O2

Slice __thiscall leveldb::InternalKey::user_key(InternalKey *this)

{
  Slice SVar1;
  Slice local_10;
  
  local_10.data_ = (this->rep_)._M_dataplus._M_p;
  local_10.size_ = (this->rep_)._M_string_length;
  SVar1 = ExtractUserKey(&local_10);
  return SVar1;
}

Assistant:

Slice user_key() const { return ExtractUserKey(rep_); }